

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall TArray<WadStuff,_WadStuff>::Resize(TArray<WadStuff,_WadStuff> *this,uint amount)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint amount_00;
  int *piVar4;
  
  uVar1 = this->Count;
  amount_00 = amount - uVar1;
  if (amount < uVar1 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar1 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    uVar2 = (ulong)this->Count;
    piVar4 = &this->Array[uVar2].Type;
    iVar3 = FString::NullString.RefCount;
    for (; iVar3 = iVar3 + 2, uVar2 < amount; uVar2 = uVar2 + 1) {
      (((WadStuff *)(piVar4 + -4))->Path).Chars = (char *)0x71deec;
      ((FString *)(piVar4 + -2))->Chars = (char *)0x71deec;
      FString::NullString.RefCount = iVar3;
      *piVar4 = 0;
      piVar4 = piVar4 + 6;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}